

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  HasBits<1> *pHVar1;
  ushort *puVar2;
  EnumValueDescriptor *pEVar3;
  pointer pcVar4;
  FeatureSet *from;
  byte bVar5;
  bool bVar6;
  EnumValueDescriptorProto *proto_00;
  void *pvVar7;
  Nonnull<const_char_*> pcVar8;
  EnumOptions *pEVar9;
  EnumOptions *pEVar10;
  FeatureSet *pFVar11;
  Arena *pAVar12;
  long lVar13;
  uint value;
  long lVar14;
  string_view value_00;
  
  puVar2 = (ushort *)(this->all_names_).payload_;
  value_00._M_len = (ulong)*puVar2;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value_00._M_str = (char *)((long)puVar2 + ~value_00._M_len);
  pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value_00,pAVar12);
  if (0 < this->value_count_) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      pEVar3 = this->values_;
      proto_00 = (EnumValueDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::EnumValueDescriptorProto>);
      EnumValueDescriptor::CopyTo
                ((EnumValueDescriptor *)(&pEVar3->super_SymbolBaseN<0> + lVar14),proto_00);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x30;
    } while (lVar13 < this->value_count_);
  }
  if (0 < this->reserved_range_count_) {
    lVar13 = 0;
    do {
      pvVar7 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                          Arena::
                          DefaultConstruct<google::protobuf::EnumDescriptorProto_EnumReservedRange>)
      ;
      if (lVar13 < this->reserved_range_count_) {
        pcVar8 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar13,(long)this->reserved_range_count_,
                            "index < reserved_range_count()");
      }
      if (pcVar8 != (Nonnull<const_char_*>)0x0) {
LAB_0020f6f6:
        CopyTo();
        goto LAB_0020f703;
      }
      *(int *)((long)pvVar7 + 0x18) = this->reserved_ranges_[lVar13].start;
      *(byte *)((long)pvVar7 + 0x10) = *(byte *)((long)pvVar7 + 0x10) | 1;
      if (lVar13 < this->reserved_range_count_) {
        pcVar8 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar13,(long)this->reserved_range_count_,
                            "index < reserved_range_count()");
      }
      if (pcVar8 != (Nonnull<const_char_*>)0x0) {
        CopyTo();
        goto LAB_0020f6f6;
      }
      *(int *)((long)pvVar7 + 0x1c) = this->reserved_ranges_[lVar13].end;
      *(byte *)((long)pvVar7 + 0x10) = *(byte *)((long)pvVar7 + 0x10) | 2;
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->reserved_range_count_);
  }
  if (0 < this->reserved_name_count_) {
    lVar13 = 0;
    do {
      pcVar4 = (this->reserved_names_[lVar13]->_M_dataplus)._M_p;
      pvVar7 = internal::RepeatedPtrFieldBase::AddString
                         (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase);
      std::__cxx11::string::_M_replace((ulong)pvVar7,0,*(char **)((long)pvVar7 + 8),(ulong)pcVar4);
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->reserved_name_count_);
  }
  bVar5 = (byte)this->field_0x1 >> 2;
  value = bVar5 & 3;
  if ((bVar5 & 3) != 0) {
    bVar6 = internal::ValidateEnum(value,(uint32_t *)&SymbolVisibility_internal_data_);
    if (!bVar6) {
LAB_0020f703:
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::SymbolVisibility_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x3e55,
                    "void google::protobuf::EnumDescriptorProto::_internal_set_visibility(::google::protobuf::SymbolVisibility)"
                   );
    }
    (proto->field_0)._impl_.visibility_ = value;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
  }
  pEVar10 = this->options_;
  if (pEVar10 != (EnumOptions *)_EnumOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    if ((proto->field_0)._impl_.options_ == (EnumOptions *)0x0) {
      pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      pEVar9 = (EnumOptions *)Arena::DefaultConstruct<google::protobuf::EnumOptions>(pAVar12);
      (proto->field_0)._impl_.options_ = pEVar9;
    }
    EnumOptions::CopyFrom((proto->field_0)._impl_.options_,pEVar10);
  }
  from = this->proto_features_;
  if (from == (FeatureSet *)_FeatureSet_default_instance_) {
    return;
  }
  *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
  if ((proto->field_0)._impl_.options_ == (EnumOptions *)0x0) {
    pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
    }
    pEVar10 = (EnumOptions *)Arena::DefaultConstruct<google::protobuf::EnumOptions>(pAVar12);
    (proto->field_0)._impl_.options_ = pEVar10;
  }
  pEVar10 = (proto->field_0)._impl_.options_;
  pHVar1 = &(pEVar10->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 1;
  if ((pEVar10->field_0)._impl_.features_ == (FeatureSet *)0x0) {
    pAVar12 = (Arena *)(pEVar10->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
    }
    pFVar11 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar12);
    (pEVar10->field_0)._impl_.features_ = pFVar11;
  }
  FeatureSet::CopyFrom((pEVar10->field_0)._impl_.features_,from);
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (visibility_keyword() != SymbolVisibility::VISIBILITY_UNSET) {
    proto->set_visibility(visibility_keyword());
  }

  if (&options() != &EnumOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}